

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O3

int P_StartScript(AActor *who,line_t *where,int script,char *map,int *args,int argcount,int flags)

{
  undefined8 uVar1;
  undefined8 *puVar2;
  int iVar3;
  level_info_t *i;
  ScriptPtr *code;
  undefined8 *puVar4;
  DLevelScript *this;
  BYTE *pBVar5;
  undefined4 in_register_0000008c;
  ulong uVar6;
  ulong uVar7;
  FString local_48;
  ulong local_40;
  FBehavior *module;
  
  local_40 = CONCAT44(in_register_0000008c,argcount);
  if ((map != (char *)0x0) && (iVar3 = strncasecmp(level.MapName.Chars,map,8), iVar3 != 0)) {
    i = FindLevelInfo(map,true);
    addDefered(i,(uint)flags >> 1 & defexealways,script,args,(int)local_40,who);
    return 1;
  }
  module = (FBehavior *)0x0;
  code = FBehavior::StaticFindScript(script,&module);
  if (code == (ScriptPtr *)0x0) {
    if (((flags & 8U) == 0) ||
       ((iVar3 = 0, who != (AActor *)0x0 &&
        (who->player == (player_t *)(&players + (long)consoleplayer * 0x54))))) {
      ScriptPresentation((int)&local_48);
      iVar3 = 0;
      Printf("P_StartScript: Unknown %s\n",local_48.Chars);
      FString::~FString(&local_48);
    }
  }
  else if (((((flags & 8U) == 0) || (netgame != true)) || (sv_cheats.Value != false)) ||
          ((code->Flags & 1) != 0)) {
    this = P_GetScriptGoing(who,where,script,code,module,args,(int)local_40,flags);
    if (this == (DLevelScript *)0x0) {
      iVar3 = 0;
    }
    else {
      iVar3 = 1;
      if ((flags & 4U) != 0) {
        iVar3 = DLevelScript::RunScript(this);
      }
    }
  }
  else {
    puVar2 = (undefined8 *)
             ((long)&((who->player->userinfo).
                      super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                     .Nodes)->Next +
             (ulong)(((who->player->userinfo).
                      super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                      .Size - 1 & 0x1cf) * 0x18));
    do {
      puVar4 = puVar2;
      puVar2 = (undefined8 *)*puVar4;
    } while (*(int *)(puVar4 + 1) != 0x1cf);
    uVar1 = *(undefined8 *)(puVar4[2] + 0x28);
    ScriptPresentation((int)&local_48);
    Printf(200,"%s tried to puke %s (\n",uVar1,local_48.Chars);
    FString::~FString(&local_48);
    iVar3 = (int)local_40;
    if (0 < iVar3) {
      uVar6 = local_40 & 0xffffffff;
      uVar7 = 0;
      do {
        pBVar5 = ", ";
        if (iVar3 - 1 == uVar7) {
          pBVar5 = "";
        }
        Printf(200,"%d%s",(ulong)(uint)args[uVar7],pBVar5);
        uVar7 = uVar7 + 1;
      } while (uVar6 != uVar7);
    }
    iVar3 = 0;
    Printf(200,")\n");
  }
  return iVar3;
}

Assistant:

int P_StartScript (AActor *who, line_t *where, int script, const char *map, const int *args, int argcount, int flags)
{
	if (map == NULL || 0 == strnicmp (level.MapName, map, 8))
	{
		FBehavior *module = NULL;
		const ScriptPtr *scriptdata;

		if ((scriptdata = FBehavior::StaticFindScript (script, module)) != NULL)
		{
			if ((flags & ACS_NET) && netgame && !sv_cheats)
			{
				// If playing multiplayer and cheats are disallowed, check to
				// make sure only net scripts are run.
				if (!(scriptdata->Flags & SCRIPTF_Net))
				{
					Printf(PRINT_BOLD, "%s tried to puke %s (\n",
						who->player->userinfo.GetName(), ScriptPresentation(script).GetChars());
					for (int i = 0; i < argcount; ++i)
					{
						Printf(PRINT_BOLD, "%d%s", args[i], i == argcount-1 ? "" : ", ");
					}
					Printf(PRINT_BOLD, ")\n");
					return false;
				}
			}
			DLevelScript *runningScript = P_GetScriptGoing (who, where, script,
				scriptdata, module, args, argcount, flags);
			if (runningScript != NULL)
			{
				if (flags & ACS_WANTRESULT)
				{
					return runningScript->RunScript();
				}
				return true;
			}
			return false;
		}
		else
		{
			if (!(flags & ACS_NET) || (who && who->player == &players[consoleplayer]))
			{
				Printf("P_StartScript: Unknown %s\n", ScriptPresentation(script).GetChars());
			}
		}
	}
	else
	{
		addDefered (FindLevelInfo (map),
					(flags & ACS_ALWAYS) ? acsdefered_t::defexealways : acsdefered_t::defexecute,
					script, args, argcount, who);
		return true;
	}
	return false;
}